

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Minimum(MinimumForm4 minimum,Image *in1,Image *in2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RCX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff8c;
  undefined2 uVar3;
  ImageTemplate<unsigned_char> *pIVar4;
  ImageTemplate<unsigned_char> *this;
  
  uVar3 = (undefined2)((uint)in_stack_ffffffffffffff8c >> 0x10);
  pIVar4 = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this = in_RDX;
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (this,(uint32_t)((ulong)pIVar4 >> 0x20),(uint32_t)pIVar4,(uint8_t)((ushort)uVar3 >> 8),
             (uint8_t)uVar3);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
  (*in_RSI)(in_RDX,0,0,in_RCX,0,0,in_RDI,0,0,uVar1,uVar2);
  return pIVar4;
}

Assistant:

Image Minimum( FunctionTable::MinimumForm4 minimum,
                   const Image & in1, const Image & in2 )
    {
        Image_Function::ParameterValidation( in1, in2 );

        Image out = in1.generate( in1.width(), in1.height(), in1.colorCount() );

        minimum( in1, 0, 0, in2, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }